

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make_protect<cs::type_t,cs::struct_builder_const&,cs::type_id_const&>
          (any *this,struct_builder *args,type_id *args_1)

{
  holder<cs::type_t> *this_00;
  proxy *ppVar1;
  
  if ((DAT_00336cc8 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::type_t> *)operator_new(0x48);
  }
  else {
    this_00 = *(holder<cs::type_t> **)
               (&holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator + DAT_00336cc8 * 8);
    DAT_00336cc8 = DAT_00336cc8 + -1;
  }
  holder<cs::type_t>::holder<cs::struct_builder_const&,cs::type_id_const&>(this_00,args,args_1);
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar1 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar1 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar1->is_rvalue = false;
  ppVar1->protect_level = 1;
  ppVar1->refcount = 1;
  ppVar1->data = &this_00->super_baseHolder;
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}